

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O0

int CVodeGetNonlinearSystemData
              (void *cvode_mem,sunrealtype *tcur,N_Vector *ypred,N_Vector *yn,N_Vector *fn,
              sunrealtype *gamma,sunrealtype *rl1,N_Vector *zn1,void **user_data)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0xba,"CVodeGetNonlinearSystemData",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_nls.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    *in_RSI = *(undefined8 *)(in_RDI + 0x168);
    *in_RDX = *(undefined8 *)(in_RDI + 0x60);
    *in_RCX = *(undefined8 *)(in_RDI + 0xd0);
    *in_R8 = *(undefined8 *)(in_RDI + 0xe8);
    *in_R9 = *(undefined8 *)(in_RDI + 0x288);
    cv_mem->cv_sunctx = *(SUNContext_conflict *)(in_RDI + 0x280);
    *gamma = *(sunrealtype *)(in_RDI + 0x68);
    *fn = *(N_Vector *)(in_RDI + 0x18);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetNonlinearSystemData(void* cvode_mem, sunrealtype* tcur,
                                N_Vector* ypred, N_Vector* yn, N_Vector* fn,
                                sunrealtype* gamma, sunrealtype* rl1,
                                N_Vector* zn1, void** user_data)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  *tcur      = cv_mem->cv_tn;
  *ypred     = cv_mem->cv_zn[0];
  *yn        = cv_mem->cv_y;
  *fn        = cv_mem->cv_ftemp;
  *gamma     = cv_mem->cv_gamma;
  *rl1       = cv_mem->cv_rl1;
  *zn1       = cv_mem->cv_zn[1];
  *user_data = cv_mem->cv_user_data;

  return (CV_SUCCESS);
}